

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RhoR.cpp
# Opt level: O2

void __thiscall
OpenMD::RhoR::RhoR(RhoR *this,SimInfo *info,string *filename,string *sele,RealType len,int nrbins,
                  RealType particleR)

{
  SelectionEvaluator *this_00;
  ulong __new_size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  StaticAnalyser::StaticAnalyser(&this->super_StaticAnalyser,info,filename,nrbins);
  (this->super_StaticAnalyser)._vptr_StaticAnalyser = (_func_int **)&PTR__RhoR_002ee2e0;
  std::__cxx11::string::string((string *)&this->selectionScript_,(string *)sele);
  this_00 = &this->evaluator_;
  SelectionEvaluator::SelectionEvaluator(this_00,info);
  SelectionManager::SelectionManager(&this->seleMan_,info);
  this->len_ = len;
  (this->histogram_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->histogram_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->histogram_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->avgRhoR_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->avgRhoR_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->avgRhoR_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SelectionEvaluator::loadScriptString(this_00,sele);
  if ((this->evaluator_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)&local_70,this_00);
    SelectionManager::setSelectionSet(&this->seleMan_,(SelectionSet *)&local_70);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_70);
  }
  __new_size = (ulong)(this->super_StaticAnalyser).nBins_;
  this->deltaR_ = this->len_ / (double)__new_size;
  std::vector<int,_std::allocator<int>_>::resize(&this->histogram_,__new_size);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->avgRhoR_,(ulong)(this->super_StaticAnalyser).nBins_);
  this->particleR_ = particleR;
  getPrefix(&local_50,filename);
  std::operator+(&local_70,&local_50,".RhoR");
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).outputFilename_);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

RhoR::RhoR(SimInfo* info, const std::string& filename,
             const std::string& sele, RealType len, int nrbins,
             RealType particleR) :
      StaticAnalyser(info, filename, nrbins),
      selectionScript_(sele), evaluator_(info), seleMan_(info), len_(len) {
    evaluator_.loadScriptString(sele);
    if (!evaluator_.isDynamic()) {
      seleMan_.setSelectionSet(evaluator_.evaluate());
    }

    deltaR_ = len_ / nBins_;

    histogram_.resize(nBins_);
    avgRhoR_.resize(nBins_);
    particleR_ = particleR;
    setOutputName(getPrefix(filename) + ".RhoR");
  }